

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_reflect.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerReflection::emit_type_member
          (CompilerReflection *this,SPIRType *type,uint32_t index)

{
  bool bVar1;
  uint32_t uVar2;
  TypedID *this_00;
  SPIRType *type_00;
  element_type *peVar3;
  string local_198 [39];
  allocator local_171;
  string local_170 [32];
  __cxx11 local_150 [32];
  string local_130 [39];
  allocator local_109;
  string local_108 [32];
  __cxx11 local_e8 [32];
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [55];
  allocator local_69;
  string local_68 [32];
  undefined1 local_48 [8];
  string name;
  SPIRType *membertype;
  uint32_t index_local;
  SPIRType *type_local;
  CompilerReflection *this_local;
  
  this_00 = (TypedID *)
            VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                      (&(type->member_types).
                        super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>,(ulong)index)
  ;
  uVar2 = TypedID::operator_cast_to_unsigned_int(this_00);
  type_00 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
  peVar3 = ::std::__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->json_stream);
  simple_json::Stream::begin_json_object(peVar3);
  to_member_name_abi_cxx11_((CompilerReflection *)local_48,(SPIRType *)this,(uint32_t)type);
  peVar3 = ::std::__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->json_stream);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_68,"name",&local_69);
  simple_json::Stream::emit_json_key_value(peVar3,(string *)local_68,(string *)local_48);
  ::std::__cxx11::string::~string(local_68);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_69);
  bVar1 = type_is_reference(this,type_00);
  if (bVar1) {
    peVar3 = ::std::
             __shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->json_stream);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_a0,"type",&local_a1);
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&type_00->parent_type);
    ::std::__cxx11::to_string(local_e8,uVar2);
    ::std::operator+((char *)local_c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5eeb74);
    simple_json::Stream::emit_json_key_value(peVar3,(string *)local_a0,local_c8);
    ::std::__cxx11::string::~string((string *)local_c8);
    ::std::__cxx11::string::~string((string *)local_e8);
    ::std::__cxx11::string::~string(local_a0);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  }
  else if (*(int *)&(type_00->super_IVariant).field_0xc == 0xf) {
    peVar3 = ::std::
             __shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->json_stream);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_108,"type",&local_109);
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type_00->super_IVariant).self);
    ::std::__cxx11::to_string(local_150,uVar2);
    ::std::operator+((char *)local_130,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5eeb74);
    simple_json::Stream::emit_json_key_value(peVar3,(string *)local_108,local_130);
    ::std::__cxx11::string::~string((string *)local_130);
    ::std::__cxx11::string::~string((string *)local_150);
    ::std::__cxx11::string::~string(local_108);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_109);
  }
  else {
    peVar3 = ::std::
             __shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->json_stream);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_170,"type",&local_171);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(local_198,this,type_00,0);
    simple_json::Stream::emit_json_key_value(peVar3,(string *)local_170,local_198);
    ::std::__cxx11::string::~string((string *)local_198);
    ::std::__cxx11::string::~string(local_170);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_171);
  }
  emit_type_member_qualifiers(this,type,index);
  peVar3 = ::std::__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->json_stream);
  simple_json::Stream::end_json_object(peVar3);
  ::std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void CompilerReflection::emit_type_member(const SPIRType &type, uint32_t index)
{
	auto &membertype = get<SPIRType>(type.member_types[index]);
	json_stream->begin_json_object();
	auto name = to_member_name(type, index);
	// FIXME we'd like to emit the offset of each member, but such offsets are
	// context dependent.  See the comment above regarding structure sizes
	json_stream->emit_json_key_value("name", name);

	if (type_is_reference(membertype))
	{
		json_stream->emit_json_key_value("type", "_" + std::to_string(membertype.parent_type));
	}
	else if (membertype.basetype == SPIRType::Struct)
	{
		json_stream->emit_json_key_value("type", "_" + std::to_string(membertype.self));
	}
	else
	{
		json_stream->emit_json_key_value("type", type_to_glsl(membertype));
	}
	emit_type_member_qualifiers(type, index);
	json_stream->end_json_object();
}